

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::E_formatter<spdlog::details::scoped_padder>::format
          (E_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  unsigned_long uVar2;
  unsigned_long value;
  scoped_padder p;
  scoped_padder sStack_58;
  char local_30 [21];
  char local_1b [3];
  char *local_18;
  
  scoped_padder::scoped_padder(&sStack_58,10,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = (msg->time).__d.__r;
  uVar2 = lVar1 / 1000000000;
  value = -uVar2;
  if (0 < (long)uVar2) {
    value = uVar2;
  }
  local_18 = fmt::v11::detail::do_format_decimal<char,unsigned_long>(local_30,value,0x15);
  if (lVar1 < -999999999) {
    local_18[-1] = '-';
    local_18 = local_18 + -1;
  }
  fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_18,local_1b);
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }